

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

uint8_t * icu_63::expandGroupLengths(uint8_t *s,uint16_t *offsets,uint16_t *lengths)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t uVar5;
  ushort uVar6;
  uint16_t uVar7;
  byte bVar8;
  
  uVar6 = 0;
  uVar7 = 0;
  uVar3 = 0;
  do {
    bVar8 = *s;
    if (uVar6 < 0xc) {
      if (bVar8 < 0xc0) {
        uVar5 = (uint16_t)(bVar8 >> 4);
        goto LAB_001c4ab6;
      }
      uVar5 = (bVar8 & 0x3f) + 0xc;
    }
    else {
      uVar5 = (uVar6 & 3) * 0x10 + (ushort)(bVar8 >> 4) + 0xc;
LAB_001c4ab6:
      bVar8 = bVar8 & 0xf;
    }
    *offsets = uVar7;
    *lengths = uVar5;
    uVar7 = uVar5 + uVar7;
    uVar4 = uVar3 + 1;
    puVar1 = lengths + 1;
    puVar2 = offsets + 1;
    if (bVar8 < 0x10) {
      uVar6 = (ushort)bVar8;
      if (bVar8 < 0xc) {
        offsets[1] = uVar7;
        lengths[1] = (ushort)bVar8;
        uVar7 = bVar8 + uVar7;
        uVar4 = uVar3 + 2;
        puVar1 = lengths + 2;
        puVar2 = offsets + 2;
      }
    }
    else {
      uVar6 = 0;
    }
    offsets = puVar2;
    lengths = puVar1;
    s = s + 1;
    uVar3 = uVar4;
    if (0x1f < uVar4) {
      return s;
    }
  } while( true );
}

Assistant:

static const uint8_t *
expandGroupLengths(const uint8_t *s,
                   uint16_t offsets[LINES_PER_GROUP+1], uint16_t lengths[LINES_PER_GROUP+1]) {
    /* read the lengths of the 32 strings in this group and get each string's offset */
    uint16_t i=0, offset=0, length=0;
    uint8_t lengthByte;

    /* all 32 lengths must be read to get the offset of the first group string */
    while(i<LINES_PER_GROUP) {
        lengthByte=*s++;

        /* read even nibble - MSBs of lengthByte */
        if(length>=12) {
            /* double-nibble length spread across two bytes */
            length=(uint16_t)(((length&0x3)<<4|lengthByte>>4)+12);
            lengthByte&=0xf;
        } else if((lengthByte /* &0xf0 */)>=0xc0) {
            /* double-nibble length spread across this one byte */
            length=(uint16_t)((lengthByte&0x3f)+12);
        } else {
            /* single-nibble length in MSBs */
            length=(uint16_t)(lengthByte>>4);
            lengthByte&=0xf;
        }

        *offsets++=offset;
        *lengths++=length;

        offset+=length;
        ++i;

        /* read odd nibble - LSBs of lengthByte */
        if((lengthByte&0xf0)==0) {
            /* this nibble was not consumed for a double-nibble length above */
            length=lengthByte;
            if(length<12) {
                /* single-nibble length in LSBs */
                *offsets++=offset;
                *lengths++=length;

                offset+=length;
                ++i;
            }
        } else {
            length=0;   /* prevent double-nibble detection in the next iteration */
        }
    }

    /* now, s is at the first group string */
    return s;
}